

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

bool __thiscall QJsonPrivate::Parser::parseString(Parser *this)

{
  char **json;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  char *str;
  char *end;
  char16_t *data;
  long in_FS_OFFSET;
  ParseError local_60;
  char32_t ch_1;
  char32_t ch;
  char16_t *pcStack_50;
  long local_48;
  QChar local_3c [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  json = &this->json;
  bVar3 = true;
  str = this->json;
  pcVar5 = str;
  while (end = this->end, pcVar5 < end) {
    _ch = (Data *)((ulong)_ch & 0xffffffff00000000);
    if (*pcVar5 == '\"') {
      bVar2 = true;
LAB_00113c23:
      *json = pcVar5 + 1;
      if (end < pcVar5 + 1) goto LAB_00113c2e;
      if (bVar2) goto LAB_00113c3b;
      *json = str;
      _ch = (Data *)0x0;
      pcStack_50 = (char16_t *)0x0;
      local_48 = 0;
      local_60 = IllegalEscapeSequence;
      goto LAB_00113ca6;
    }
    if (*pcVar5 == '\\') {
      bVar3 = false;
      bVar2 = false;
      goto LAB_00113c23;
    }
    bVar2 = scanUtf8Char(json,end,&ch);
    if (!bVar2) {
      this->lastError = IllegalUTF8String;
      goto LAB_00113c5f;
    }
    bVar3 = (bool)(bVar3 & (uint)ch < 0x80);
    pcVar5 = *json;
  }
  *json = pcVar5 + 1;
  if (end < pcVar5 + 1) {
LAB_00113c2e:
    this->lastError = UnterminatedString;
LAB_00113c5f:
    bVar3 = false;
  }
  else {
LAB_00113c3b:
    if (bVar3) {
      QCborContainerPrivate::appendAsciiString
                ((this->container).d.ptr,str,(qsizetype)(pcVar5 + ~(ulong)str + 1));
    }
    else {
      QCborContainerPrivate::appendUtf8String
                ((this->container).d.ptr,str,(qsizetype)(pcVar5 + ~(ulong)str + 1));
    }
    bVar3 = true;
  }
  goto LAB_00113e25;
LAB_00113ca6:
  if (end <= str) goto LAB_00113dca;
  ch_1 = L'\0';
  if (*str == '\\') {
    *json = str + 1;
    if (end <= str + 1) {
LAB_00113e12:
      this->lastError = local_60;
      goto LAB_00113e19;
    }
    pcVar5 = str + 2;
    *json = pcVar5;
    bVar1 = str[1];
    ch_1 = (uint)bVar1;
    switch(bVar1) {
    case 0x6e:
      ch_1 = L'\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      break;
    case 0x72:
      ch_1 = L'\r';
      break;
    case 0x74:
      ch_1 = L'\t';
      break;
    case 0x75:
      ch_1 = L'\0';
      if (pcVar5 <= end + -4) {
        iVar6 = 4;
        while (bVar3 = iVar6 != 0, iVar6 = iVar6 + -1, bVar3) {
          ch_1 = ch_1 << 4;
          uVar4 = QtMiscUtils::fromHex((int)*pcVar5);
          if (uVar4 == 0xffffffff) goto LAB_00113e12;
          ch_1 = uVar4 | ch_1;
          pcVar5 = *json + 1;
          *json = pcVar5;
        }
        goto LAB_00113d9b;
      }
      goto LAB_00113e12;
    default:
      ch_1 = (uint)bVar1;
      if (bVar1 != 0x22) {
        if (bVar1 == 0x2f) {
          ch_1 = L'/';
        }
        else if (bVar1 == 0x66) {
          ch_1 = L'\f';
        }
        else if (bVar1 == 0x62) {
          ch_1 = L'\b';
        }
        else {
          ch_1 = (uint)bVar1;
          if (bVar1 == 0x5c) {
            ch_1 = L'\\';
          }
        }
      }
    }
  }
  else {
    if (*str == '\"') goto LAB_00113dca;
    bVar3 = scanUtf8Char(json,end,&ch_1);
    if (!bVar3) {
      local_60 = IllegalUTF8String;
      goto LAB_00113e12;
    }
  }
LAB_00113d9b:
  local_3c = (QChar  [2])QChar::fromUcs4(ch_1);
  QString::append((QString *)&ch,local_3c,2 - (ulong)((uint)local_3c < 0x10000));
  str = this->json;
  end = this->end;
  goto LAB_00113ca6;
LAB_00113dca:
  *json = str + 1;
  if (end < str + 1) {
    this->lastError = UnterminatedString;
LAB_00113e19:
    bVar3 = false;
  }
  else {
    data = pcStack_50;
    if (pcStack_50 == (char16_t *)0x0) {
      data = L"";
    }
    QCborContainerPrivate::appendByteData
              ((this->container).d.ptr,(char *)data,local_48 * 2,String,(ValueFlags)0x4);
    bVar3 = true;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ch);
LAB_00113e25:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Parser::parseString()
{
    const char *start = json;

    // try to parse a utf-8 string without escape sequences, and note whether it's 7bit ASCII.

    bool isUtf8 = true;
    bool isAscii = true;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        if (*json == '\\') {
            isAscii = false;
            // If we find escape sequences, we store UTF-16 as there are some
            // escape sequences which are hard to represent in UTF-8.
            // (plain "\\ud800" for example)
            isUtf8 = false;
            break;
        }
        if (!scanUtf8Char(json, end, &ch)) {
            lastError = QJsonParseError::IllegalUTF8String;
            return false;
        }
        if (ch > 0x7f)
            isAscii = false;
    }
    ++json;
    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    // no escape sequences, we are done
    if (isUtf8) {
        if (isAscii)
            container->appendAsciiString(start, json - start - 1);
        else
            container->appendUtf8String(start, json - start - 1);
        return true;
    }

    json = start;

    QString ucs4;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        else if (*json == '\\') {
            if (!scanEscapeSequence(json, end, &ch)) {
                lastError = QJsonParseError::IllegalEscapeSequence;
                return false;
            }
        } else {
            if (!scanUtf8Char(json, end, &ch)) {
                lastError = QJsonParseError::IllegalUTF8String;
                return false;
            }
        }
        ucs4.append(QChar::fromUcs4(ch));
    }
    ++json;

    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    container->appendByteData(reinterpret_cast<const char *>(ucs4.constData()), ucs4.size() * 2,
                              QCborValue::String, QtCbor::Element::StringIsUtf16);
    return true;
}